

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O0

TimingControl *
slang::ast::EventListControl::fromSyntax
          (Compilation *compilation,SyntaxNode *syntax,ASTContext *context)

{
  bool bVar1;
  size_type sVar2;
  reference ppTVar3;
  EventListControl *pEVar4;
  iterator ppTVar5;
  SmallVectorBase<slang::ast::TimingControl_*> *in_RDI;
  span<const_slang::ast::TimingControl_*const,_18446744073709551615UL> sVar6;
  SmallVectorBase<slang::ast::TimingControl_*> *unaff_retaddr;
  SyntaxNode *in_stack_00000008;
  ASTContext *in_stack_00000010;
  TimingControl *ev;
  iterator __end2;
  iterator __begin2;
  SmallVector<slang::ast::TimingControl_*,_5UL> *__range2;
  EventListControl *result;
  SmallVector<slang::ast::TimingControl_*,_5UL> events;
  TimingControl *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  BumpAllocator *in_stack_ffffffffffffff18;
  SyntaxNode *in_stack_ffffffffffffff50;
  iterator local_a8;
  SmallVectorBase<slang::ast::TimingControl_*> local_60 [2];
  SmallVectorBase<slang::ast::TimingControl_*> *local_10;
  EventListControl *local_8;
  
  local_10 = in_RDI;
  SmallVector<slang::ast::TimingControl_*,_5UL>::SmallVector
            ((SmallVector<slang::ast::TimingControl_*,_5UL> *)0xa269a1);
  collectEvents(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  sVar2 = SmallVectorBase<slang::ast::TimingControl_*>::size(local_60);
  if (sVar2 == 1) {
    ppTVar3 = SmallVectorBase<slang::ast::TimingControl_*>::operator[](local_60,0);
    local_8 = (EventListControl *)*ppTVar3;
  }
  else {
    sVar6 = SmallVectorBase<slang::ast::TimingControl_*>::ccopy(local_10,in_stack_ffffffffffffff18);
    slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffff50);
    pEVar4 = BumpAllocator::
             emplace<slang::ast::EventListControl,std::span<slang::ast::TimingControl_const*const,18446744073709551615ul>,slang::SourceRange>
                       ((BumpAllocator *)sVar6._M_ptr,
                        (span<const_slang::ast::TimingControl_*const,_18446744073709551615UL> *)
                        sVar6._M_extent._M_extent_value._M_extent_value,(SourceRange *)local_10);
    local_a8 = SmallVectorBase<slang::ast::TimingControl_*>::begin(local_60);
    ppTVar5 = SmallVectorBase<slang::ast::TimingControl_*>::end(local_60);
    for (; local_8 = pEVar4, local_a8 != ppTVar5; local_a8 = local_a8 + 1) {
      bVar1 = TimingControl::bad(*local_a8);
      if (bVar1) {
        local_8 = (EventListControl *)
                  TimingControl::badCtrl
                            ((Compilation *)CONCAT17(bVar1,in_stack_ffffffffffffff00),
                             in_stack_fffffffffffffef8);
        break;
      }
    }
  }
  SmallVector<slang::ast::TimingControl_*,_5UL>::~SmallVector
            ((SmallVector<slang::ast::TimingControl_*,_5UL> *)0xa26b92);
  return &local_8->super_TimingControl;
}

Assistant:

TimingControl& EventListControl::fromSyntax(Compilation& compilation, const SyntaxNode& syntax,
                                            const ASTContext& context) {
    SmallVector<TimingControl*> events;
    collectEvents(context, syntax, events);

    if (events.size() == 1)
        return *events[0];

    auto result = compilation.emplace<EventListControl>(events.ccopy(compilation),
                                                        syntax.sourceRange());
    for (auto ev : events) {
        if (ev->bad())
            return badCtrl(compilation, result);
    }

    return *result;
}